

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O3

void __thiscall
TPZSkylNSymMatrix<std::complex<float>_>::MultAdd
          (TPZSkylNSymMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  _ComplexT _Var1;
  complex<float> **ppcVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  long lVar15;
  complex<float> *pcVar16;
  float in_XMM0_Da;
  float in_XMM0_Db;
  undefined8 uVar17;
  undefined8 uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  iVar10 = (int)alpha._M_value;
  iVar11 = iVar10;
  if (iVar10 == 0) {
    iVar8 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    if (iVar8 == (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00d128b9;
LAB_00d128bf:
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZSkylNSymMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ," <matrixs with incompatible dimensions>");
    iVar8 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  }
  else {
    iVar8 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
LAB_00d128b9:
    if ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != iVar8)
    goto LAB_00d128bf;
  }
  if ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow == iVar8) {
    lVar3 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    lVar6 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    lVar9 = lVar3;
    if (lVar3 == lVar6) goto LAB_00d12903;
  }
  else {
    lVar6 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  }
  (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(z,iVar8,lVar6);
  lVar3 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  lVar9 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
LAB_00d12903:
  if ((((lVar9 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
       (lVar9 != lVar3)) ||
      (lVar6 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
      lVar6 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) ||
     (lVar6 != (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," y.Cols()",9);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," z.Cols() ",10);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," x.Rows() ",10);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," y.Rows() ",10);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," z.Rows() ",10);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZSkylNSymMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ," incompatible dimensions\n");
  }
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,z,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar11);
  lVar6 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if (0 < lVar6) {
    lVar3 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
    lVar9 = 0;
    do {
      if (0 < lVar3) {
        lVar7 = 0;
        do {
          ppcVar2 = (this->fElem).fStore;
          lVar12 = (long)(int)((ulong)((long)ppcVar2[lVar7 + 1] - (long)ppcVar2[lVar7]) >> 3);
          lVar15 = lVar7 - lVar12;
          pcVar16 = x->fElem +
                    (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar9 +
                    lVar15;
          puVar13 = *(undefined8 **)
                     ((this->fStorage).fExtAlloc[(ulong)(iVar10 == 0) * 4 + -0xb]._M_value +
                     lVar7 * 8);
          puVar14 = puVar13 + lVar12;
          fVar24 = 0.0;
          fVar25 = 0.0;
          while( true ) {
            pcVar16 = pcVar16 + 1;
            puVar14 = puVar14 + -1;
            if (puVar14 <= puVar13) break;
            fVar20 = (float)*puVar14;
            fVar23 = (float)((ulong)*puVar14 >> 0x20);
            _Var1 = pcVar16->_M_value;
            fVar21 = (float)(_Var1 >> 0x20);
            fVar19 = (float)_Var1 * fVar20 - fVar21 * fVar23;
            fVar22 = fVar20 * fVar21 + fVar23 * (float)_Var1;
            uVar17 = CONCAT44(fVar22,fVar19);
            if ((NAN(fVar19)) && (uVar17 = CONCAT44(fVar22,fVar19), NAN(fVar22))) {
              uVar17 = __mulsc3(fVar20,fVar23,_Var1,fVar21);
            }
            fVar24 = fVar24 + (float)uVar17;
            fVar25 = fVar25 + (float)((ulong)uVar17 >> 0x20);
          }
          if (puVar14 == puVar13) {
            _Var1 = (this->fElem).fStore[lVar7]->_M_value;
            fVar20 = (float)_Var1;
            fVar23 = (float)(_Var1 >> 0x20);
            _Var1 = pcVar16->_M_value;
            fVar21 = (float)(_Var1 >> 0x20);
            fVar19 = (float)_Var1 * fVar20 - fVar21 * fVar23;
            fVar22 = fVar20 * fVar21 + fVar23 * (float)_Var1;
            uVar17 = CONCAT44(fVar22,fVar19);
            if ((NAN(fVar19)) && (uVar17 = CONCAT44(fVar22,fVar19), NAN(fVar22))) {
              uVar17 = __mulsc3(fVar20,fVar23,_Var1,fVar21);
            }
            fVar24 = fVar24 + (float)uVar17;
            fVar25 = fVar25 + (float)((ulong)uVar17 >> 0x20);
          }
          fVar20 = in_XMM0_Da * fVar24 - in_XMM0_Db * fVar25;
          fVar23 = in_XMM0_Da * fVar25 + in_XMM0_Db * fVar24;
          uVar17 = CONCAT44(fVar23,fVar20);
          if ((NAN(fVar20)) && (uVar17 = CONCAT44(fVar23,fVar20), NAN(fVar23))) {
            uVar17 = __mulsc3(fVar24,fVar25,CONCAT44(in_XMM0_Db,in_XMM0_Da),in_XMM0_Db);
          }
          lVar5 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
          if ((lVar5 <= lVar7) ||
             ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = lVar5 * lVar9;
          _Var1 = z->fElem[lVar5 + lVar7]._M_value;
          z->fElem[lVar5 + lVar7]._M_value =
               CONCAT44((float)((ulong)uVar17 >> 0x20) + (float)(_Var1 >> 0x20),
                        (float)uVar17 + (float)_Var1);
          if (((lVar15 < -1) ||
              (lVar5 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
              lVar5 <= lVar15 + 1)) ||
             ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          puVar14 = *(undefined8 **)
                     ((this->fStorage).fExtAlloc[(ulong)(iVar10 != 0) * 4 + -0xb]._M_value +
                     lVar7 * 8);
          puVar13 = puVar14 + lVar12 + -1;
          if (puVar14 < puVar13) {
            _Var1 = x->fElem[(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                             lVar9 + lVar7]._M_value;
            fVar24 = (float)(_Var1 >> 0x20);
            pcVar16 = z->fElem + lVar5 * lVar9 + lVar15 + 1;
            do {
              uVar17 = *puVar13;
              fVar23 = (float)((ulong)uVar17 >> 0x20);
              fVar25 = (float)uVar17 * in_XMM0_Da - fVar23 * in_XMM0_Db;
              fVar20 = in_XMM0_Da * fVar23 + in_XMM0_Db * (float)uVar17;
              uVar18 = CONCAT44(fVar20,fVar25);
              if ((NAN(fVar25)) && (uVar18 = CONCAT44(fVar20,fVar25), NAN(fVar20))) {
                uVar18 = __mulsc3(in_XMM0_Da,in_XMM0_Db,uVar17,fVar23);
              }
              fVar20 = (float)((ulong)uVar18 >> 0x20);
              fVar25 = (float)uVar18;
              fVar19 = fVar25 * (float)_Var1 - fVar24 * fVar20;
              fVar23 = (float)_Var1 * fVar20 + fVar25 * fVar24;
              uVar17 = CONCAT44(fVar23,fVar19);
              if ((NAN(fVar19)) && (uVar17 = CONCAT44(fVar23,fVar19), NAN(fVar23))) {
                uVar17 = __mulsc3(fVar25,fVar20,_Var1,fVar24);
              }
              pcVar16->_M_value =
                   CONCAT44((float)(pcVar16->_M_value >> 0x20) + (float)((ulong)uVar17 >> 0x20),
                            (float)pcVar16->_M_value + (float)uVar17);
              pcVar16 = pcVar16 + 1;
              puVar13 = puVar13 + -1;
            } while (puVar14 < puVar13);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar3);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar6);
  }
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x, const TPZFMatrix<TVar> &y,
  TPZFMatrix<TVar> &z, const TVar alpha, const TVar beta, const int opt)const
{
  // Computes z = beta * y + alpha * opt(this)*x
  // z and x cannot overlap in memory
  if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,
    " <matrixs with incompatible dimensions>");
  if (z.Rows() != x.Rows() || z.Cols() != x.Cols())
    z.Redim(x.Rows(), x.Cols());
  if (x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows()
    || x.Rows() != z.Rows())
  {
    cout << "x.Cols = " << x.Cols() << " y.Cols()" << y.Cols()
        << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows()
        << " y.Rows() " << y.Rows() << " z.Rows() " << z.Rows() << endl;
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, " incompatible dimensions\n");
  }
  this->PrepareZ(y, z, beta, opt);
  int64_t rows = this->Rows();
  int64_t xcols = x.Cols();
  int64_t ic, r;
  for (ic = 0; ic < xcols; ic++)
  {
    for (r = 0; r < rows; r++)
    {
      int64_t offset = Size(r);
      TVar val = 0.;
      const TVar *p = &x.g((r - offset + 1), ic);
        TVar *diag, *diaglast;
        if (opt == 0)
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
        else
        {
            diag = fElem[r] + offset - 1;
            diaglast = fElem[r];
        }
      while (diag > diaglast)
      {
        val += *diag--**p;
        p ++;
      }
      if (diag == diaglast)
      {
        diag = fElem[r];
        val += *diag * *p;
      }
      z(r, ic) += val * alpha;
      TVar *zp = &z((r - offset + 1), ic);
      val = x.g(r, ic);
        if(opt == 0)
        {
          diag = fElem[r] + offset - 1;
          diaglast = fElem[r];
        }
        else
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
      while (diag > diaglast)
      {
        *zp += alpha * *diag--*val;
        zp ++;
      }
      //z.Print("z");
    }
  }
}